

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int __thiscall fmt::v8::detail::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  int iVar1;
  size_t sVar2;
  uint *puVar3;
  int local_24;
  int quotient;
  bigint *divisor_local;
  bigint *this_local;
  
  if (this == divisor) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x25b,"");
  }
  iVar1 = compare(this,divisor);
  if (iVar1 < 0) {
    this_local._4_4_ = 0;
  }
  else {
    sVar2 = buffer<unsigned_int>::size((buffer<unsigned_int> *)divisor);
    puVar3 = buffer<unsigned_int>::operator[]<unsigned_long>
                       ((buffer<unsigned_int> *)divisor,sVar2 - 1);
    if (*puVar3 == 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format-inl.h"
                  ,0x25d,"");
    }
    align(this,divisor);
    local_24 = 0;
    do {
      subtract_aligned(this,divisor);
      local_24 = local_24 + 1;
      iVar1 = compare(this,divisor);
      this_local._4_4_ = local_24;
    } while (-1 < iVar1);
  }
  return this_local._4_4_;
}

Assistant:

FMT_CONSTEXPR20 int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    align(divisor);
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }